

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall
FIX::Message::setGroup
          (Message *this,string *msg,FieldBase *field,string *string,size_type *pos,FieldMap *map,
          DataDictionary *dataDictionary)

{
  _func_int **pp_Var1;
  unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> uVar2;
  FieldMap *pFVar3;
  size_type *psVar4;
  FieldBase *msg_00;
  bool bVar5;
  int iVar6;
  int field_00;
  _func_int **pp_Var7;
  pointer pGVar8;
  Group *this_00;
  message_order *order;
  type map_00;
  undefined1 local_b8 [8];
  FieldBase field_1;
  size_type oldPos;
  unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> pGroup;
  DataDictionary *pDD;
  int delim;
  int group;
  FieldMap *map_local;
  size_type *pos_local;
  string *string_local;
  FieldBase *field_local;
  string *msg_local;
  Message *this_local;
  
  _delim = map;
  map_local = (FieldMap *)pos;
  pos_local = (size_type *)string;
  string_local = (string *)field;
  field_local = (FieldBase *)msg;
  msg_local = (string *)this;
  pDD._4_4_ = FieldBase::getTag(field);
  pGroup._M_t.super___uniq_ptr_impl<FIX::Group,_std::default_delete<FIX::Group>_>._M_t.
  super__Tuple_impl<0UL,_FIX::Group_*,_std::default_delete<FIX::Group>_>.
  super__Head_base<0UL,_FIX::Group_*,_false>._M_head_impl =
       (__uniq_ptr_data<FIX::Group,_std::default_delete<FIX::Group>,_true,_true>)
       (__uniq_ptr_impl<FIX::Group,_std::default_delete<FIX::Group>_>)0x0;
  bVar5 = DataDictionary::getGroup
                    (dataDictionary,(string *)field_local,pDD._4_4_,(int *)&pDD,
                     (DataDictionary **)&pGroup);
  if (bVar5) {
    std::unique_ptr<FIX::Group,std::default_delete<FIX::Group>>::
    unique_ptr<std::default_delete<FIX::Group>,void>
              ((unique_ptr<FIX::Group,std::default_delete<FIX::Group>> *)&oldPos);
    do {
      pp_Var1 = map_local->_vptr_FieldMap;
      pp_Var7 = (_func_int **)std::__cxx11::string::size();
      psVar4 = pos_local;
      pFVar3 = map_local;
      if (pp_Var7 <= pp_Var1) break;
      field_1.m_metrics._8_8_ = map_local->_vptr_FieldMap;
      pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::get
                         ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
      extractField((FieldBase *)local_b8,this,(string *)psVar4,(size_type *)pFVar3,dataDictionary,
                   dataDictionary,pGVar8);
      iVar6 = FieldBase::getTag((FieldBase *)local_b8);
      uVar2 = pGroup;
      if (iVar6 == (int)pDD) {
LAB_002549fc:
        pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::get
                           ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
        pFVar3 = _delim;
        iVar6 = pDD._4_4_;
        if (pGVar8 != (pointer)0x0) {
          pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::release
                             ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
          FieldMap::addGroupPtr(pFVar3,iVar6,&pGVar8->super_FieldMap,false);
        }
        this_00 = (Group *)operator_new(0x78);
        field_00 = FieldBase::getTag((FieldBase *)local_b8);
        iVar6 = (int)pDD;
        order = DataDictionary::getOrderedFields
                          ((DataDictionary *)
                           pGroup._M_t.
                           super___uniq_ptr_impl<FIX::Group,_std::default_delete<FIX::Group>_>._M_t.
                           super__Tuple_impl<0UL,_FIX::Group_*,_std::default_delete<FIX::Group>_>.
                           super__Head_base<0UL,_FIX::Group_*,_false>._M_head_impl);
        Group::Group(this_00,field_00,iVar6,order);
        std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::reset
                  ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos,this_00);
LAB_00254bb9:
        pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::get
                           ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
        if (pGVar8 == (pointer)0x0) {
          bVar5 = true;
        }
        else {
          pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::operator->
                             ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
          FieldMap::addField(&pGVar8->super_FieldMap,(FieldBase *)local_b8);
          msg_00 = field_local;
          psVar4 = pos_local;
          pFVar3 = map_local;
          map_00 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::operator*
                             ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
          setGroup(this,(string *)msg_00,(FieldBase *)local_b8,(string *)psVar4,(size_type *)pFVar3,
                   &map_00->super_FieldMap,
                   (DataDictionary *)
                   pGroup._M_t.super___uniq_ptr_impl<FIX::Group,_std::default_delete<FIX::Group>_>.
                   _M_t.super__Tuple_impl<0UL,_FIX::Group_*,_std::default_delete<FIX::Group>_>.
                   super__Head_base<0UL,_FIX::Group_*,_false>._M_head_impl);
          bVar5 = false;
        }
      }
      else {
        iVar6 = FieldBase::getTag((FieldBase *)local_b8);
        bVar5 = DataDictionary::isField
                          ((DataDictionary *)
                           uVar2._M_t.
                           super___uniq_ptr_impl<FIX::Group,_std::default_delete<FIX::Group>_>._M_t.
                           super__Tuple_impl<0UL,_FIX::Group_*,_std::default_delete<FIX::Group>_>.
                           super__Head_base<0UL,_FIX::Group_*,_false>._M_head_impl,iVar6);
        if (bVar5) {
          pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::get
                             ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
          if (pGVar8 != (pointer)0x0) {
            pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::operator->
                               ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos)
            ;
            iVar6 = FieldBase::getTag((FieldBase *)local_b8);
            bVar5 = FieldMap::isSetField(&pGVar8->super_FieldMap,iVar6);
            if (!bVar5) goto LAB_00254b11;
          }
          goto LAB_002549fc;
        }
LAB_00254b11:
        uVar2._M_t.super___uniq_ptr_impl<FIX::Group,_std::default_delete<FIX::Group>_>._M_t.
        super__Tuple_impl<0UL,_FIX::Group_*,_std::default_delete<FIX::Group>_>.
        super__Head_base<0UL,_FIX::Group_*,_false>._M_head_impl =
             pGroup._M_t.super___uniq_ptr_impl<FIX::Group,_std::default_delete<FIX::Group>_>._M_t.
             super__Tuple_impl<0UL,_FIX::Group_*,_std::default_delete<FIX::Group>_>.
             super__Head_base<0UL,_FIX::Group_*,_false>._M_head_impl;
        iVar6 = FieldBase::getTag((FieldBase *)local_b8);
        bVar5 = DataDictionary::isField
                          ((DataDictionary *)
                           uVar2._M_t.
                           super___uniq_ptr_impl<FIX::Group,_std::default_delete<FIX::Group>_>._M_t.
                           super__Tuple_impl<0UL,_FIX::Group_*,_std::default_delete<FIX::Group>_>.
                           super__Head_base<0UL,_FIX::Group_*,_false>._M_head_impl,iVar6);
        if (bVar5) goto LAB_00254bb9;
        pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::get
                           ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
        pFVar3 = _delim;
        iVar6 = pDD._4_4_;
        if (pGVar8 != (pointer)0x0) {
          pGVar8 = std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::release
                             ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
          FieldMap::addGroupPtr(pFVar3,iVar6,&pGVar8->super_FieldMap,false);
        }
        map_local->_vptr_FieldMap = (_func_int **)field_1.m_metrics._8_8_;
        bVar5 = true;
      }
      FieldBase::~FieldBase((FieldBase *)local_b8);
    } while (!bVar5);
    std::unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_>::~unique_ptr
              ((unique_ptr<FIX::Group,_std::default_delete<FIX::Group>_> *)&oldPos);
  }
  return;
}

Assistant:

void Message::setGroup( const std::string& msg, const FieldBase& field,
                        const std::string& string,
                        std::string::size_type& pos, FieldMap& map,
                        const DataDictionary& dataDictionary )
{
  int group = field.getTag();
  int delim;
  const DataDictionary* pDD = 0;
  if ( !dataDictionary.getGroup( msg, group, delim, pDD ) ) return ;
  SmartPtr<Group> pGroup;

  while ( pos < string.size() )
  {
    std::string::size_type oldPos = pos;
    FieldBase field = extractField( string, pos, &dataDictionary, &dataDictionary, pGroup.get() );
       
    // Start a new group because...
    if (// found delimiter
    (field.getTag() == delim) ||
    // no delimiter, but field belongs to group OR field already processed
    (pDD->isField( field.getTag() ) && (pGroup.get() == 0 || pGroup->isSetField( field.getTag() )) ))
    {
      if ( pGroup.get() )
      {
        map.addGroupPtr( group, pGroup.release(), false );
      }
      pGroup.reset( new Group( field.getTag(), delim, pDD->getOrderedFields() ) );
    }
    else if ( !pDD->isField( field.getTag() ) )
    {
      if ( pGroup.get() )
      {
        map.addGroupPtr( group, pGroup.release(), false );
      }
      pos = oldPos;
      return ;
    }

    if ( !pGroup.get() ) return ;
    pGroup->addField( field );
    setGroup( msg, field, string, pos, *pGroup, *pDD );
  }
}